

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ErrorCheckRules.cpp
# Opt level: O2

bool __thiscall
GrcManager::CompatibleWithVersion
          (GrcManager *this,int fxdVersion,int *pfxdSilfNeeded,int *pfxdCpilrNeeded,
          bool *pfFixPassConstraints)

{
  bool bVar1;
  int iVar2;
  
  *pfxdSilfNeeded = fxdVersion;
  bVar1 = true;
  if (fxdVersion < 0x50000) {
    iVar2 = fxdVersion;
    if (this->m_fBasicJust == false) {
      iVar2 = 0x20000;
      if (0x20000 < fxdVersion) {
        iVar2 = fxdVersion;
      }
      *pfxdSilfNeeded = iVar2;
      iVar2 = 0x20000;
      if (0x20000 < *pfxdCpilrNeeded) {
        iVar2 = *pfxdCpilrNeeded;
      }
      *pfxdCpilrNeeded = iVar2;
      iVar2 = *pfxdSilfNeeded;
    }
    if (0x7f8 < (ulong)((long)(this->m_vpglfcReplcmtClasses).
                              super__Vector_base<GdlGlyphClassDefn_*,_std::allocator<GdlGlyphClassDefn_*>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(this->m_vpglfcReplcmtClasses).
                             super__Vector_base<GdlGlyphClassDefn_*,_std::allocator<GdlGlyphClassDefn_*>_>
                             ._M_impl.super__Vector_impl_data._M_start)) {
      if (iVar2 < 0x30001) {
        iVar2 = 0x30000;
      }
      *pfxdSilfNeeded = iVar2;
      iVar2 = 0x30000;
      if (0x30000 < *pfxdCpilrNeeded) {
        iVar2 = *pfxdCpilrNeeded;
      }
      *pfxdCpilrNeeded = iVar2;
      iVar2 = *pfxdSilfNeeded;
    }
    if (fxdVersion < iVar2) {
      *pfFixPassConstraints = false;
    }
    bVar1 = GdlRenderer::CompatibleWithVersion
                      (this->m_prndr,fxdVersion,pfxdSilfNeeded,pfxdCpilrNeeded,pfFixPassConstraints)
    ;
    bVar1 = bVar1 && iVar2 <= fxdVersion;
  }
  return bVar1;
}

Assistant:

bool GrcManager::CompatibleWithVersion(int fxdVersion, int * pfxdSilfNeeded,
	int * pfxdCpilrNeeded, bool * pfFixPassConstraints)
{
	*pfxdSilfNeeded = fxdVersion;

	if (fxdVersion >= kfxdMaxSilfVersion)
		return true;

	if (!m_fBasicJust)
	{
		// We need version 2.0 for basic justification.
		*pfxdSilfNeeded = max(0x00020000, *pfxdSilfNeeded);
		*pfxdCpilrNeeded = max(0x00020000, *pfxdCpilrNeeded);
	}

	if (m_vpglfcReplcmtClasses.size() >= kMaxReplcmtClassesV1_2)
	{
		// For a large set of replacement classes, we need 3.0.
		*pfxdSilfNeeded = max(0x00030000, *pfxdSilfNeeded);
		*pfxdCpilrNeeded = max(0x00030000, *pfxdCpilrNeeded);
	}

	// For now, the Glat table version does not affect the other tables.
	//if (m_vpsymGlyphAttrs.size() >= kMaxGlyphAttrsGlat1)
	//{
	//	// For a large number of glyph attributes, we need 3.0.
	//	*pfxdNeeded = max(0x00030000, *pfxdNeeded);
	//}

	if (*pfxdSilfNeeded > fxdVersion)
		*pfFixPassConstraints = false;

	bool fRet = (*pfxdSilfNeeded <= fxdVersion);

	fRet = (m_prndr->CompatibleWithVersion(fxdVersion, pfxdSilfNeeded, pfxdCpilrNeeded,
				pfFixPassConstraints) 
		&& fRet);

	return fRet;
}